

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_rc_postencode_update_drop_frame(AV1_COMP *cpi)

{
  long *in_RDI;
  int in_stack_0000001c;
  AV1_COMP *in_stack_00000020;
  
  update_buffer_level(in_stack_00000020,in_stack_0000001c);
  *(undefined4 *)(in_RDI + 0xc107) = 0;
  *(undefined4 *)((long)in_RDI + 0x60834) = 0;
  *(undefined4 *)(in_RDI + 0xc100) = *(undefined4 *)((long)in_RDI + 0x607f4);
  *(int *)((long)in_RDI + 0x6089c) = (int)in_RDI[0x77f7];
  *(undefined4 *)(in_RDI + 0xc114) = *(undefined4 *)((long)in_RDI + 0x3bfbc);
  *(undefined4 *)((long)in_RDI + 0x60814) = 1;
  if ((int)in_RDI[0xc0f6] != 0) {
    in_RDI[0xc0f7] = 0;
  }
  if ((*(int *)(*in_RDI + 0xc750) != 0) && (1 < (int)in_RDI[0x13a67])) {
    *(undefined1 *)((long)in_RDI + (long)(int)in_RDI[0x13a66] + 0x9d4b4) = 1;
    *(undefined1 *)((long)in_RDI + (long)(int)in_RDI[0x13a66] + 0x9d4b8) = 1;
  }
  if ((int)in_RDI[0x13a66] == (int)in_RDI[0x13a67] + -1) {
    *(int *)(in_RDI + 0x13a68) = (int)in_RDI[0x13a67];
  }
  *(undefined4 *)((long)in_RDI + 0x9d344) = *(undefined4 *)((long)in_RDI + 0x9d33c);
  return;
}

Assistant:

void av1_rc_postencode_update_drop_frame(AV1_COMP *cpi) {
  // Update buffer level with zero size, update frame counters, and return.
  update_buffer_level(cpi, 0);
  cpi->rc.rc_2_frame = 0;
  cpi->rc.rc_1_frame = 0;
  cpi->rc.prev_avg_frame_bandwidth = cpi->rc.avg_frame_bandwidth;
  cpi->rc.prev_coded_width = cpi->common.width;
  cpi->rc.prev_coded_height = cpi->common.height;
  cpi->rc.prev_frame_is_dropped = 1;
  // On a scene/slide change for dropped frame: reset the avg_source_sad to 0,
  // otherwise the avg_source_sad can get too large and subsequent frames
  // may miss the scene/slide detection.
  if (cpi->rc.high_source_sad) cpi->rc.avg_source_sad = 0;
  if (cpi->ppi->use_svc && cpi->svc.number_spatial_layers > 1) {
    cpi->svc.last_layer_dropped[cpi->svc.spatial_layer_id] = true;
    cpi->svc.drop_spatial_layer[cpi->svc.spatial_layer_id] = true;
  }
  if (cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
    cpi->svc.prev_number_spatial_layers = cpi->svc.number_spatial_layers;
  }
  cpi->svc.prev_number_temporal_layers = cpi->svc.number_temporal_layers;
}